

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawPrimitive
          (QPixmapStyle *this,PrimitiveElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  QTextEdit *pQVar1;
  QListView *pQVar2;
  QWidget *in_RCX;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  QWidget *in_RDI;
  QWidget *in_R8;
  QStyleOption *unaff_retaddr;
  QStyleOption *in_stack_00000008;
  QWidget *in_stack_00000730;
  QPainter *in_stack_00000738;
  QStyleOption *in_stack_00000740;
  PrimitiveElement in_stack_0000074c;
  QCommonStyle *in_stack_00000750;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0:
  case 1:
    pQVar1 = qobject_cast<QTextEdit_const*>((QObject *)0x3fed5b);
    if (pQVar1 != (QTextEdit *)0x0) {
      drawTextEdit((QPixmapStyle *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                   (QPainter *)in_RCX,in_R8);
    }
    break;
  default:
    QCommonStyle::drawPrimitive
              (in_stack_00000750,in_stack_0000074c,in_stack_00000740,in_stack_00000738,
               in_stack_00000730);
    break;
  case 3:
    break;
  case 5:
  case 0x12:
    drawLineEdit((QPixmapStyle *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                 (QPainter *)in_RCX,in_R8);
    break;
  case 0xd:
  case 0xe:
    drawPushButton((QPixmapStyle *)in_RDI,(QStyleOption *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)
                   ,(QPainter *)in_RDX,in_RCX);
    break;
  case 0x1a:
    drawCheckBox((QPixmapStyle *)widget,in_stack_00000008,(QPainter *)unaff_retaddr,in_RDI);
    break;
  case 0x1f:
    drawRadioButton((QPixmapStyle *)widget,in_stack_00000008,(QPainter *)unaff_retaddr,in_RDI);
    break;
  case 0x2c:
    pQVar2 = qobject_cast<QListView_const*>((QObject *)0x3fedbc);
    if (pQVar2 == (QListView *)0x0) {
      QCommonStyle::drawPrimitive
                (in_stack_00000750,in_stack_0000074c,in_stack_00000740,in_stack_00000738,
                 in_stack_00000730);
    }
    else {
      drawPanelItemViewItem
                ((QPixmapStyle *)in_stack_00000008,unaff_retaddr,(QPainter *)in_RDI,
                 (QWidget *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  return;
}

Assistant:

void QPixmapStyle::drawPrimitive(PrimitiveElement element, const QStyleOption *option,
                                 QPainter *painter, const QWidget *widget) const
{
    switch (element) {
    case PE_FrameFocusRect: //disable focus rectangle
        break;
    case PE_PanelButtonBevel:
    case PE_PanelButtonCommand:
        drawPushButton(option, painter, widget);
        break;
    case PE_PanelLineEdit:
    case PE_FrameLineEdit:
        drawLineEdit(option, painter, widget);
        break;
    case PE_Frame:
#if QT_CONFIG(textedit)
    case PE_FrameDefaultButton:
        if (qobject_cast<const QTextEdit*>(widget))
            drawTextEdit(option, painter, widget);
        break;
#endif
    case PE_IndicatorCheckBox:
        drawCheckBox(option, painter, widget);
        break;
    case PE_IndicatorRadioButton:
        drawRadioButton(option, painter, widget);
        break;
    case PE_PanelItemViewItem:
#if QT_CONFIG(listview)
        if (qobject_cast<const QListView*>(widget))
            drawPanelItemViewItem(option, painter, widget);
        else
#endif
            QCommonStyle::drawPrimitive(element, option, painter, widget);
        break;
    default:
        QCommonStyle::drawPrimitive(element, option, painter, widget);
    }
}